

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxil.c
# Opt level: O3

void update_xz_tilde(OSQPWorkspace *work)

{
  OSQPData *pOVar1;
  long lVar2;
  OSQPSettings *pOVar3;
  c_float *pcVar4;
  c_float *pcVar5;
  c_float *pcVar6;
  c_float *pcVar7;
  long lVar8;
  long lVar9;
  
  pOVar1 = work->data;
  lVar2 = pOVar1->n;
  if (0 < lVar2) {
    pOVar3 = work->settings;
    pcVar7 = work->xz_tilde;
    pcVar4 = work->x_prev;
    pcVar5 = pOVar1->q;
    lVar8 = 0;
    do {
      pcVar7[lVar8] = pOVar3->sigma * pcVar4[lVar8] - pcVar5[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar2 != lVar8);
  }
  lVar8 = pOVar1->m;
  if (lVar8 < 1) {
    pcVar7 = work->xz_tilde;
  }
  else {
    pcVar4 = work->z_prev;
    pcVar5 = work->rho_inv_vec;
    pcVar6 = work->y;
    pcVar7 = work->xz_tilde;
    lVar9 = 0;
    do {
      pcVar7[lVar2 + lVar9] = pcVar4[lVar9] - pcVar5[lVar9] * pcVar6[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar8 != lVar9);
  }
  (*work->linsys_solver->solve)(work->linsys_solver,pcVar7);
  return;
}

Assistant:

void update_xz_tilde(OSQPWorkspace *work) {
  // Compute right-hand side
  compute_rhs(work);

  // Solve linear system
  work->linsys_solver->solve(work->linsys_solver, work->xz_tilde);
}